

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinit.c
# Opt level: O2

void Xevent_after_raid(DspInterface dsp)

{
  init_Xevent(dsp);
  (*dsp->bitblt_to_screen)
            (dsp,(DLword *)0x0,(dsp->Visible).x,(dsp->Visible).y,(dsp->Visible).width,
             (dsp->Visible).height);
  XFlush(dsp->display_id);
  return;
}

Assistant:

void Xevent_after_raid(DspInterface dsp)
{
  init_Xevent(dsp);
  (dsp->bitblt_to_screen)(dsp, 0, dsp->Visible.x, dsp->Visible.y, dsp->Visible.width,
                          dsp->Visible.height);
  XLOCK;
  XFlush(dsp->display_id);
  XUNLOCK(dsp);

}